

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  uint uVar1;
  Scope *this;
  StatementSyntax *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  SyntaxNode *pSVar6;
  specific_symbol_iterator<slang::ast::VariableSymbol> sVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpressionSyntax *pEVar8;
  SourceLocation SVar9;
  SourceLocation SVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  size_type extraout_RDX;
  ulong uVar11;
  size_t sVar12;
  byte bVar13;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> iVar14;
  Expression *stopExpr;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  UnrollVisitor visitor;
  Expression *local_378;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_370;
  SmallVectorBase<const_slang::ast::Expression_*> local_360 [2];
  SmallVectorBase<const_slang::ast::VariableSymbol_*> local_320 [2];
  SmallVectorBase<const_slang::ast::Expression_*> local_2e0 [2];
  SourceRange local_2a0;
  UnrollVisitor local_290;
  undefined4 extraout_var_01;
  
  local_2e0[0].data_ = (pointer)local_2e0[0].firstElement;
  local_2e0[0].len = 0;
  local_2e0[0].cap = 5;
  local_320[0].data_ = (pointer)local_320[0].firstElement;
  local_320[0].len = 0;
  local_320[0].cap = 5;
  if (((syntax->initializers).elements.size_ == 0) ||
     (pSVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                         (&syntax->initializers,0), pSVar6->kind != ForVariableDeclaration)) {
    uVar11 = (syntax->initializers).elements.size_ + 1;
    if (1 < uVar11) {
      bVar13 = 0;
      sVar12 = 0;
      do {
        pSVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                           (&syntax->initializers,sVar12);
        pEVar8 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar6);
        SVar10._0_4_ = Expression::bind((int)pEVar8,(sockaddr *)context,0x20);
        SVar10._4_4_ = extraout_var;
        local_290._0_8_ = SVar10;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_2e0,
                   (Expression **)&local_290);
        bVar3 = Expression::bad((Expression *)SVar10);
        bVar13 = bVar13 | bVar3;
        sVar12 = sVar12 + 1;
      } while (uVar11 >> 1 != sVar12);
      goto LAB_002796ac;
    }
  }
  else {
    this = (context->scope).ptr;
    if (this == (Scope *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                );
    }
    iVar14 = Scope::membersOfType<slang::ast::VariableSymbol>(this);
    sVar7 = iVar14.m_begin.current;
    if (sVar7.current != iVar14.m_end.current.current) {
      do {
        if ((0x18 < *(int *)sVar7.current - 0x3aU) ||
           ((0x1800c0fU >> (*(int *)sVar7.current - 0x3aU & 0x1f) & 1) == 0)) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::VariableSymbol]");
        }
        local_290._0_8_ = sVar7.current;
        SmallVectorBase<slang::ast::VariableSymbol_const*>::
        emplace_back<slang::ast::VariableSymbol_const*>
                  ((SmallVectorBase<slang::ast::VariableSymbol_const*> *)local_320,
                   (VariableSymbol **)&local_290);
        do {
          sVar7.current = *(Symbol **)((long)sVar7.current + 0x28);
          if ((SourceLocation)sVar7.current == (SourceLocation)0x0) break;
        } while ((0x18 < *(int *)sVar7.current - 0x3aU) ||
                ((0x1800c0fU >> (*(int *)sVar7.current - 0x3aU & 0x1f) & 1) == 0));
      } while (sVar7.current != iVar14.m_end.current.current);
    }
  }
  bVar13 = 0;
LAB_002796ac:
  local_378 = (Expression *)0x0;
  if (syntax->stopExpr != (ExpressionSyntax *)0x0) {
    iVar4 = Expression::bind((int)syntax->stopExpr,(sockaddr *)context,0);
    local_378 = (Expression *)CONCAT44(extraout_var_00,iVar4);
  }
  local_360[0].data_ = (pointer)local_360[0].firstElement;
  local_360[0].len = 0;
  local_360[0].cap = 5;
  uVar11 = (syntax->steps).elements.size_ + 1;
  if (1 < uVar11) {
    sVar12 = 0;
    do {
      pEVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&syntax->steps,sVar12);
      SVar9._0_4_ = Expression::bind((int)pEVar8,(sockaddr *)context,0x20);
      SVar9._4_4_ = extraout_var_01;
      local_290._0_8_ = SVar9;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_360,
                 (Expression **)&local_290);
      bVar3 = Expression::bad((Expression *)SVar9);
      bVar13 = bVar13 | bVar3;
      iVar4 = *(int *)SVar9;
      if (iVar4 < 0xe) {
        if ((iVar4 != 0) &&
           ((iVar4 != 10 || (3 < ((Expression *)((long)SVar9 + 0x30))->kind - UnaryOp)))) {
LAB_00279781:
          bVar13 = 1;
          ASTContext::addDiag(context,(DiagCode)0x1f0008,*(SourceRange *)((long)SVar9 + 0x20));
        }
      }
      else if ((iVar4 != 0xe) && (iVar4 != 0x15)) goto LAB_00279781;
      sVar12 = sVar12 + 1;
    } while (uVar11 >> 1 != sVar12);
  }
  if ((bVar13 != 0) ||
     ((local_378 != (Expression *)0x0 && (bVar3 = Expression::bad(local_378), bVar3)))) {
    local_290._0_8_ = (SourceLocation)0x0;
    SVar10 = (SourceLocation)
             BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                       (&compilation->super_BumpAllocator,(Statement **)&local_290);
  }
  else {
    uVar1 = (stmtCtx->flags).m_bits;
    (stmtCtx->flags).m_bits = uVar1 | 9;
    pSVar2 = (syntax->statement).ptr;
    if (pSVar2 == (StatementSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
                );
    }
    iVar4 = Statement::bind((int)pSVar2,(sockaddr *)context,(socklen_t)stmtCtx);
    local_290._0_4_ =
         SmallVectorBase<const_slang::ast::Expression_*>::copy
                   (local_2e0,(EVP_PKEY_CTX *)compilation,src);
    local_290._4_4_ = extraout_var_03;
    iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_360,(EVP_PKEY_CTX *)compilation,src_00);
    local_370.data_ = (pointer)CONCAT44(extraout_var_04,iVar5);
    local_2a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    SVar10 = (SourceLocation)
             BumpAllocator::
             emplace<slang::ast::ForLoopStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,
                        (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&local_290,
                        &local_378,&local_370,(Statement *)CONCAT44(extraout_var_02,iVar4),
                        &local_2a0);
    iVar5 = SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                      (local_320,(EVP_PKEY_CTX *)compilation,src_01);
    ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)((long)SVar10 + 0x30))
    ->data_ = (pointer)CONCAT44(extraout_var_05,iVar5);
    ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)((long)SVar10 + 0x38))
    ->data_ = (pointer)extraout_RDX;
    if (((Statement *)CONCAT44(extraout_var_02,iVar4))->kind == Invalid) {
      local_290._0_8_ = SVar10;
      SVar10 = (SourceLocation)
               BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&compilation->super_BumpAllocator,(Statement **)&local_290);
    }
    else if (((uVar1 & 8) == 0) && ((compilation->options).strictDriverChecking == false)) {
      UnrollVisitor::UnrollVisitor(&local_290,context);
      SVar9 = SVar10;
      UnrollVisitor::handle(&local_290,(ForLoopStatement *)SVar10);
      SmallVectorBase<slang::Diagnostic>::cleanup
                ((SmallVectorBase<slang::Diagnostic> *)&local_290.evalCtx.diags,
                 (EVP_PKEY_CTX *)SVar9);
      if ((SourceLocation *)
          local_290.evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
          (SourceLocation *)
          local_290.evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement) {
        free(local_290.evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
      }
      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                ((SmallVectorBase<slang::ast::EvalContext::Frame> *)&local_290.evalCtx.stack,
                 (EVP_PKEY_CTX *)SVar9);
    }
    (stmtCtx->flags).m_bits = uVar1 & 9 | (stmtCtx->flags).m_bits & 0x16;
  }
  if (local_360[0].data_ != (pointer)local_360[0].firstElement) {
    free(local_360[0].data_);
  }
  if (local_320[0].data_ != (pointer)local_320[0].firstElement) {
    free(local_320[0].data_);
  }
  if (local_2e0[0].data_ != (pointer)local_2e0[0].firstElement) {
    free(local_2e0[0].data_);
  }
  return (Statement *)SVar10;
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.getOptions().strictDriverChecking) {
        UnrollVisitor visitor(context);
        visitor.visit(*result);
    }

    return *result;
}